

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::XmlReporter(XmlReporter *this,ReporterConfig *_config)

{
  ostream *os;
  ReporterConfig *_config_local;
  XmlReporter *this_local;
  
  StreamingReporterBase::StreamingReporterBase(&this->super_StreamingReporterBase,_config);
  (this->super_StreamingReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
  super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__XmlReporter_00221a50;
  Timer::Timer(&this->m_testCaseTimer);
  os = ReporterConfig::stream(_config);
  XmlWriter::XmlWriter(&this->m_xml,os);
  this->m_sectionDepth = 0;
  (this->super_StreamingReporterBase).m_reporterPrefs.shouldRedirectStdOut = true;
  return;
}

Assistant:

XmlReporter( ReporterConfig const& _config )
        :   StreamingReporterBase( _config ),
            m_xml(_config.stream()),
            m_sectionDepth( 0 )
        {
            m_reporterPrefs.shouldRedirectStdOut = true;
        }